

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_session.c
# Opt level: O0

int dlep_session_generate_signal_status
              (dlep_session *session,int32_t signal,oonf_layer2_neigh_key *neighbor,
              dlep_status status,char *msg)

{
  int iVar1;
  char *msg_local;
  dlep_status status_local;
  oonf_layer2_neigh_key *neighbor_local;
  int32_t signal_local;
  dlep_session *session_local;
  
  iVar1 = _generate_signal(session,signal,neighbor);
  if (iVar1 == 0) {
    iVar1 = dlep_writer_add_status(&session->writer,status,msg);
    if (iVar1 == 0) {
      session_local._4_4_ = dlep_writer_finish_signal(&session->writer,session->log_source);
    }
    else {
      if ((log_global_mask[session->log_source] & 4) != 0) {
        oonf_log(LOG_SEVERITY_WARN,session->log_source,"src/generic/dlep/dlep_session.c",0x28f,
                 (void *)0x0,0,"Could not add status TLV");
      }
      session_local._4_4_ = -1;
    }
  }
  else {
    if ((log_global_mask[session->log_source] & 4) != 0) {
      oonf_log(LOG_SEVERITY_WARN,session->log_source,"src/generic/dlep/dlep_session.c",0x28b,
               (void *)0x0,0,"Could not generate signal %u",signal);
    }
    session_local._4_4_ = -1;
  }
  return session_local._4_4_;
}

Assistant:

int
dlep_session_generate_signal_status(struct dlep_session *session, int32_t signal, const struct oonf_layer2_neigh_key *neighbor,
  enum dlep_status status, const char *msg) {
  if (_generate_signal(session, signal, neighbor)) {
    OONF_WARN(session->log_source, "Could not generate signal %u", signal);
    return -1;
  }
  if (dlep_writer_add_status(&session->writer, status, msg)) {
    OONF_WARN(session->log_source, "Could not add status TLV");
    return -1;
  }
  return dlep_writer_finish_signal(&session->writer, session->log_source);
}